

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void loop_body(Vm *vm)

{
  _Bool _Var1;
  undefined1 local_11;
  Vm *vm_local;
  
  advance(vm);
  open_scope(vm);
  while( true ) {
    _Var1 = check(vm,TOKEN_CLOSE_BRACE);
    local_11 = 0;
    if (!_Var1) {
      _Var1 = check(vm,TOKEN_EOF);
      local_11 = _Var1 ^ 0xff;
    }
    if ((local_11 & 1) == 0) break;
    stmt(vm);
  }
  close_scope(vm);
  advance(vm);
  return;
}

Assistant:

static void loop_body(Vm *vm) {
    advance(vm);
    open_scope(vm);
    while (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
        stmt(vm);
    }
    close_scope(vm);
    advance(vm);
}